

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::onMessage(Application *this)

{
  SessionID *in_RDX;
  OrderCancelRequest *in_RSI;
  
  onMessage((Application *)
            &this[-1].m_orderMatcher.m_markets._M_t._M_impl.super__Rb_tree_header._M_node_count,
            in_RSI,in_RDX);
  return;
}

Assistant:

void Application::onMessage(const FIX42::OrderCancelRequest &message, const FIX::SessionID &) {
  FIX::OrigClOrdID origClOrdID;
  FIX::Symbol symbol;
  FIX::Side side;

  message.get(origClOrdID);
  message.get(symbol);
  message.get(side);

  try {
    processCancel(origClOrdID, symbol, convert(side));
  } catch (std::exception &) {}
}